

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void EVauto_submit_func(CManager_conflict cm,void *vstone)

{
  int iVar1;
  event_item *event_00;
  CManager_conflict in_RSI;
  CManager_conflict in_RDI;
  CManager unaff_retaddr;
  event_item *event;
  int stone_num;
  CManager_conflict in_stack_000000c0;
  event_path_data in_stack_ffffffffffffffe0;
  int line;
  
  iVar1 = (int)in_RSI;
  IntCManager_lock(unaff_retaddr,(char *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  event_00 = get_free_event(in_stack_ffffffffffffffe0);
  event_00->event_encoded = 0;
  event_00->decoded_event = (void *)0x0;
  event_00->reference_format = (FMFormat)0x0;
  event_00->format = (CMFormat)0x0;
  event_00->free_func = (EVFreeFunction)0x0;
  event_00->attrs = (attr_list)0x0;
  event_00->cm = in_RDI;
  internal_path_submit(in_RSI,iVar1,event_00);
  do {
    iVar1 = process_local_actions(in_stack_000000c0);
    line = (int)((ulong)in_RSI >> 0x20);
  } while (iVar1 != 0);
  return_event((event_path_data)cm,(event_item *)vstone);
  IntCManager_unlock(unaff_retaddr,(char *)in_RDI,line);
  return;
}

Assistant:

static void
EVauto_submit_func(CManager cm, void* vstone)
{
    int stone_num = (int)(intptr_t) vstone;
    event_item *event;
    CManager_lock(cm);
    event = get_free_event(cm->evp);
    event->event_encoded = 0;
    event->decoded_event = NULL;
    event->reference_format = NULL;
    event->format = NULL;
    event->free_func = NULL;
    event->attrs = NULL;
    event->cm = cm;
    internal_path_submit(cm, stone_num, event);
    while (process_local_actions(cm));
    return_event(cm->evp, event);
    CManager_unlock(cm);
}